

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
               (string *s,char *fmt,float *v,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,float *args_1
               ,float *args_2,float *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               float *args_5,float *args_6,float *args_7)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  float *in_RDX;
  float *in_RSI;
  string *in_RDI;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd70;
  char **in_stack_fffffffffffffd78;
  char **in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string local_268 [32];
  undefined8 local_248;
  string local_240 [32];
  stringstream local_220 [8];
  char *in_stack_fffffffffffffde8;
  undefined1 local_210 [4];
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe4c;
  string local_98 [40];
  float *in_stack_ffffffffffffff90;
  undefined5 in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  copyToFormatString(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  lVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffffa0,0x2a);
  bVar4 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffffa0,0x73);
  bVar5 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffffa0,100);
  bVar6 = lVar2 != -1;
  if ((bVar4 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe4c);
    std::__cxx11::string::operator+=(in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    if ((bVar6 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffde8);
    }
    if ((bVar5 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                 in_stack_fffffffffffffde8);
      }
      std::__cxx11::string::c_str();
      formatOne<float&>(in_stack_fffffffffffffd88,(float *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd78);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_220);
      std::ostream::operator<<(local_210,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_248 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::stringstream::~stringstream(local_220);
    }
  }
  stringPrintfRecursive<std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,
             (float *)CONCAT17(bVar4,CONCAT16(bVar5,CONCAT15(bVar6,in_stack_ffffffffffffff98))),
             in_stack_ffffffffffffff90,in_RCX,in_RDX,in_RSI,(float *)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}